

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_value(sqlite3_stmt *pStmt,int i,sqlite3_value *pValue)

{
  int iVar1;
  double local_48;
  int local_24;
  int rc;
  sqlite3_value *pValue_local;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  iVar1 = sqlite3_value_type(pValue);
  switch(iVar1) {
  case 1:
    local_24 = sqlite3_bind_int64(pStmt,i,(pValue->u).i);
    break;
  case 2:
    if ((pValue->flags & 8) == 0) {
      local_48 = (double)(pValue->u).i;
    }
    else {
      local_48 = (pValue->u).r;
    }
    local_24 = sqlite3_bind_double(pStmt,i,local_48);
    break;
  case 3:
    local_24 = bindText(pStmt,i,pValue->z,(long)pValue->n,(_func_void_void_ptr *)0xffffffffffffffff,
                        pValue->enc);
    break;
  case 4:
    if ((pValue->flags & 0x400) == 0) {
      local_24 = sqlite3_bind_blob(pStmt,i,pValue->z,pValue->n,
                                   (_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      local_24 = sqlite3_bind_zeroblob(pStmt,i,(pValue->u).nZero);
    }
    break;
  default:
    local_24 = sqlite3_bind_null(pStmt,i);
  }
  return local_24;
}

Assistant:

SQLITE_API int sqlite3_bind_value(sqlite3_stmt *pStmt, int i, const sqlite3_value *pValue){
  int rc;
  switch( sqlite3_value_type((sqlite3_value*)pValue) ){
    case SQLITE_INTEGER: {
      rc = sqlite3_bind_int64(pStmt, i, pValue->u.i);
      break;
    }
    case SQLITE_FLOAT: {
      assert( pValue->flags & (MEM_Real|MEM_IntReal) );
      rc = sqlite3_bind_double(pStmt, i,
          (pValue->flags & MEM_Real) ? pValue->u.r : (double)pValue->u.i
      );
      break;
    }
    case SQLITE_BLOB: {
      if( pValue->flags & MEM_Zero ){
        rc = sqlite3_bind_zeroblob(pStmt, i, pValue->u.nZero);
      }else{
        rc = sqlite3_bind_blob(pStmt, i, pValue->z, pValue->n,SQLITE_TRANSIENT);
      }
      break;
    }
    case SQLITE_TEXT: {
      rc = bindText(pStmt,i,  pValue->z, pValue->n, SQLITE_TRANSIENT,
                              pValue->enc);
      break;
    }
    default: {
      rc = sqlite3_bind_null(pStmt, i);
      break;
    }
  }
  return rc;
}